

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuImageIO.cpp
# Opt level: O2

void tcu::ImageIO::loadPKM(CompressedTexture *dst,Archive *archive,char *fileName)

{
  pointer puVar1;
  deUint16 dVar2;
  deUint16 dVar3;
  int iVar4;
  undefined4 extraout_var;
  InternalError *pIVar5;
  UniquePtr<tcu::Resource,_de::DefaultDeleter<tcu::Resource>_> resource;
  deUint8 magic [6];
  Resource *resource_00;
  
  iVar4 = (*archive->_vptr_Archive[2])(archive,fileName);
  resource_00 = (Resource *)CONCAT44(extraout_var,iVar4);
  resource.super_UniqueBase<tcu::Resource,_de::DefaultDeleter<tcu::Resource>_>.m_data.ptr =
       resource_00;
  (*resource_00->_vptr_Resource[2])(resource_00,magic,6);
  iVar4 = bcmp("PKM 10",magic,6);
  if (iVar4 != 0) {
    pIVar5 = (InternalError *)__cxa_allocate_exception(0x38);
    InternalError::InternalError
              (pIVar5,"Signature doesn\'t match PKM signature",
               ((resource.super_UniqueBase<tcu::Resource,_de::DefaultDeleter<tcu::Resource>_>.m_data
                .ptr)->m_name)._M_dataplus._M_p,
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/framework/common/tcuImageIO.cpp"
               ,0xee);
    __cxa_throw(pIVar5,&InternalError::typeinfo,Exception::~Exception);
  }
  dVar2 = readBigEndianShort(resource_00);
  if (dVar2 == 0) {
    readBigEndianShort(resource.super_UniqueBase<tcu::Resource,_de::DefaultDeleter<tcu::Resource>_>.
                       m_data.ptr);
    readBigEndianShort(resource.super_UniqueBase<tcu::Resource,_de::DefaultDeleter<tcu::Resource>_>.
                       m_data.ptr);
    dVar2 = readBigEndianShort(resource.
                               super_UniqueBase<tcu::Resource,_de::DefaultDeleter<tcu::Resource>_>.
                               m_data.ptr);
    dVar3 = readBigEndianShort(resource.
                               super_UniqueBase<tcu::Resource,_de::DefaultDeleter<tcu::Resource>_>.
                               m_data.ptr);
    CompressedTexture::setStorage(dst,COMPRESSEDTEXFORMAT_ETC1_RGB8,(uint)dVar2,(uint)dVar3,1);
    puVar1 = (dst->m_data).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
             .super__Vector_impl_data._M_start;
    (*(resource.super_UniqueBase<tcu::Resource,_de::DefaultDeleter<tcu::Resource>_>.m_data.ptr)->
      _vptr_Resource[2])
              (resource.super_UniqueBase<tcu::Resource,_de::DefaultDeleter<tcu::Resource>_>.m_data.
               ptr,puVar1,
               (ulong)(uint)(*(int *)&(dst->m_data).
                                      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                      ._M_impl.super__Vector_impl_data._M_finish - (int)puVar1));
    de::details::UniqueBase<tcu::Resource,_de::DefaultDeleter<tcu::Resource>_>::~UniqueBase
              (&resource.super_UniqueBase<tcu::Resource,_de::DefaultDeleter<tcu::Resource>_>);
    return;
  }
  pIVar5 = (InternalError *)__cxa_allocate_exception(0x38);
  InternalError::InternalError
            (pIVar5,"Unsupported PKM type",
             ((resource.super_UniqueBase<tcu::Resource,_de::DefaultDeleter<tcu::Resource>_>.m_data.
              ptr)->m_name)._M_dataplus._M_p,
             "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/framework/common/tcuImageIO.cpp"
             ,0xf2);
  __cxa_throw(pIVar5,&InternalError::typeinfo,Exception::~Exception);
}

Assistant:

void loadPKM (CompressedTexture& dst, const tcu::Archive& archive, const char* fileName)
{
	de::UniquePtr<Resource> resource(archive.getResource(fileName));

	// Check magic and version.
	deUint8 refMagic[] = {'P', 'K', 'M', ' ', '1', '0'};
	deUint8 magic[6];
	resource->read(magic, DE_LENGTH_OF_ARRAY(magic));

	if (memcmp(refMagic, magic, sizeof(magic)) != 0)
		throw InternalError("Signature doesn't match PKM signature", resource->getName().c_str(), __FILE__, __LINE__);

	deUint16 type = readBigEndianShort(resource.get());
	if (type != ETC1_RGB_NO_MIPMAPS)
		throw InternalError("Unsupported PKM type", resource->getName().c_str(), __FILE__, __LINE__);

	deUint16	width			= readBigEndianShort(resource.get());
	deUint16	height			= readBigEndianShort(resource.get());
	deUint16	activeWidth		= readBigEndianShort(resource.get());
	deUint16	activeHeight	= readBigEndianShort(resource.get());

    DE_UNREF(width && height);

	dst.setStorage(COMPRESSEDTEXFORMAT_ETC1_RGB8, (int)activeWidth, (int)activeHeight);
	resource->read((deUint8*)dst.getData(), dst.getDataSize());
}